

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.cpp
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *a,QRectF *rect)

{
  long lVar1;
  QRectF *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  double height;
  double width;
  double y;
  double x;
  double *in_stack_ffffffffffffffb8;
  QDBusArgument *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure(in_stack_ffffffffffffffc0);
  QDBusArgument::operator>>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QDBusArgument::operator>>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QDBusArgument::operator>>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QDBusArgument::operator>>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QDBusArgument::endStructure(in_stack_ffffffffffffffc0);
  QRectF::setRect(in_RSI,-NAN,-NAN,-NAN,-NAN);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &a, QRectF &rect)
{
    double x, y, width, height;
    a.beginStructure();
    a >> x >> y >> width >> height;
    a.endStructure();

    rect.setRect(qreal(x), qreal(y), qreal(width), qreal(height));
    return a;
}